

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

bool __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this,uint k,int *lastOcc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type pNVar4;
  int iVar5;
  
  if (k < 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0x117,"(k >= directSize)","k >= directSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pNVar4 = this->root;
  if (pNVar4 != (Type)0x0) {
    iVar5 = 0xc;
    do {
      if (iVar5 + -4 == -4) {
        *lastOcc = *(int *)((long)&pNVar4[1]._vptr_Node + (ulong)(k & 0xf) * 4);
        return true;
      }
      pNVar4 = (Type)pNVar4[(ulong)(k >> ((byte)iVar5 & 0x1f) & 0xf) + 1]._vptr_Node;
      iVar5 = iVar5 + -4;
    } while (pNVar4 != (Type)0x0);
  }
  return false;
}

Assistant:

bool GetNonDirect(uint k, V& lastOcc) const
        {
            Assert(k >= directSize);
            if (root == nullptr)
            {
                return false;
            }
            Node* curr = root;
            for (int level = levels - 1; level > 0; level--)
            {
                Inner* inner = (Inner*)curr;
                uint i = innerIdx(level, k);
                if (inner->children[i] == 0)
                    return false;
                else
                    curr = inner->children[i];
            }
            Leaf* leaf = (Leaf*)curr;
            lastOcc = leaf->values[leafIdx(k)];
            return true;
        }